

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_get_sibling(lys_node *siblings,char *mod_name,int mod_name_len,char *name,int nam_len,
                   LYS_NODE type,lys_node **ret)

{
  lys_node **pplVar1;
  char *pcVar2;
  LYS_NODE LVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  lys_node *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  lys_module *module;
  
  if (((siblings == (lys_node *)0x0) || (mod_name == (char *)0x0)) || (name == (char *)0x0)) {
    __assert_fail("siblings && mod_name && name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x94,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  if ((type & (LYS_USES|LYS_GROUPING)) != LYS_UNKNOWN) {
    __assert_fail("!(type & (LYS_USES | LYS_GROUPING))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x95,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  sVar6 = (size_t)(uint)nam_len;
  if (mod_name_len == 0) {
    sVar5 = strlen(mod_name);
    mod_name_len = (int)sVar5;
  }
  if (nam_len == 0) {
    sVar6 = strlen(name);
  }
  while (LVar3 = siblings->nodetype, LVar3 == LYS_USES) {
    siblings = siblings->child;
    if (siblings == (lys_node *)0x0) {
      return 1;
    }
  }
  plVar7 = siblings;
  if (LVar3 == LYS_GROUPING) {
    while (LVar3 = plVar7->nodetype, LVar3 == LYS_GROUPING) {
      pplVar1 = &plVar7->prev;
      plVar7 = *pplVar1;
      if (*pplVar1 == siblings) {
        return 1;
      }
    }
  }
  if (LVar3 == LYS_EXT) {
    if (plVar7->padding[1] != '\x01') goto LAB_00159f13;
    plVar9 = (lys_node *)plVar7->dsc;
  }
  else {
    plVar9 = plVar7->parent;
    if (plVar9 == (lys_node *)0x0) goto LAB_00159f13;
  }
  if ((plVar9->nodetype == LYS_AUGMENT) && (plVar9 = plVar9->prev, plVar9 == (lys_node *)0x0))
  goto LAB_00159f13;
  module = (lys_module *)0x0;
  do {
    if (plVar9->nodetype != LYS_USES) goto LAB_00159f89;
    plVar9 = plVar9->parent;
    if (plVar9 == (lys_node *)0x0) break;
    if (plVar9->nodetype == LYS_AUGMENT) {
      plVar9 = plVar9->prev;
    }
  } while (plVar9 != (lys_node *)0x0);
  do {
    if (plVar7 == (lys_node *)0x0) {
LAB_00159f6b:
      plVar9 = (lys_node *)0x0;
      module = (lys_module *)0x0;
LAB_00159f89:
      plVar7 = lys_getnext((lys_node *)0x0,plVar9,module,0xb);
      if (plVar7 == (lys_node *)0x0) {
        return 1;
      }
      do {
        if ((type == LYS_UNKNOWN) || ((plVar7->nodetype & type) != LYS_UNKNOWN)) {
          plVar8 = plVar7->module;
          if ((plVar8->field_0x40 & 1) != 0) {
            plVar8 = (lys_module *)plVar8->data;
          }
          pcVar2 = plVar8->name;
          if (((pcVar2 == mod_name) ||
              ((iVar4 = strncmp(pcVar2,mod_name,(long)mod_name_len), iVar4 == 0 &&
               (pcVar2[mod_name_len] == '\0')))) &&
             ((pcVar2 = plVar7->name, pcVar2 == name ||
              ((iVar4 = strncmp(pcVar2,name,(long)(int)sVar6), iVar4 == 0 &&
               (pcVar2[(int)sVar6] == '\0')))))) {
            if (ret != (lys_node **)0x0) {
              *ret = plVar7;
              return 0;
            }
            return 0;
          }
        }
        plVar7 = lys_getnext(plVar7,plVar9,module,0xb);
        if (plVar7 == (lys_node *)0x0) {
          return 1;
        }
      } while( true );
    }
LAB_00159f13:
    if (plVar7->nodetype != LYS_EXT) {
      plVar9 = plVar7->parent;
      if (plVar9 != (lys_node *)0x0) goto LAB_00159f38;
LAB_00159f73:
      module = plVar7->module;
      if ((module->field_0x40 & 1) != 0) {
        module = (lys_module *)module->data;
      }
      plVar9 = (lys_node *)0x0;
      goto LAB_00159f89;
    }
    if (plVar7->padding[1] != '\x01') goto LAB_00159f73;
    plVar9 = (lys_node *)plVar7->dsc;
LAB_00159f38:
    if (((plVar9->nodetype == LYS_AUGMENT) && (plVar9->prev == (lys_node *)0x0)) ||
       (plVar7->nodetype != LYS_USES)) goto LAB_00159f73;
    plVar7 = plVar7->parent;
    if (plVar7 == (lys_node *)0x0) goto LAB_00159f6b;
    if (plVar7->nodetype == LYS_AUGMENT) {
      plVar7 = plVar7->prev;
    }
  } while( true );
}

Assistant:

int
lys_get_sibling(const struct lys_node *siblings, const char *mod_name, int mod_name_len, const char *name,
                int nam_len, LYS_NODE type, const struct lys_node **ret)
{
    const struct lys_node *node, *parent = NULL;
    const struct lys_module *mod = NULL;
    const char *node_mod_name;

    assert(siblings && mod_name && name);
    assert(!(type & (LYS_USES | LYS_GROUPING)));

    /* fill the lengths in case the caller is so indifferent */
    if (!mod_name_len) {
        mod_name_len = strlen(mod_name);
    }
    if (!nam_len) {
        nam_len = strlen(name);
    }

    while (siblings && (siblings->nodetype == LYS_USES)) {
        siblings = siblings->child;
    }
    if (!siblings) {
        /* unresolved uses */
        return EXIT_FAILURE;
    }

    if (siblings->nodetype == LYS_GROUPING) {
        for (node = siblings; (node->nodetype == LYS_GROUPING) && (node->prev != siblings); node = node->prev);
        if (node->nodetype == LYS_GROUPING) {
            /* we went through all the siblings, only groupings there - no valid sibling */
            return EXIT_FAILURE;
        }
        /* update siblings to be valid */
        siblings = node;
    }

    /* set parent correctly */
    parent = lys_parent(siblings);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (!parent) {
        /* handle situation when there is a top-level uses referencing a foreign grouping */
        for (node = siblings; lys_parent(node) && (node->nodetype == LYS_USES); node = lys_parent(node));
        mod = lys_node_module(node);
    }

    /* try to find the node */
    node = NULL;
    while ((node = lys_getnext(node, parent, mod, LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
        if (!type || (node->nodetype & type)) {
            /* module name comparison */
            node_mod_name = lys_node_module(node)->name;
            if (!ly_strequal(node_mod_name, mod_name, 1) && (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len])) {
                continue;
            }

            /* direct name check */
            if (ly_strequal(node->name, name, 1) || (!strncmp(node->name, name, nam_len) && !node->name[nam_len])) {
                if (ret) {
                    *ret = node;
                }
                return EXIT_SUCCESS;
            }
        }
    }

    return EXIT_FAILURE;
}